

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerArrayMethods(Builtins *this)

{
  SymbolKind kind_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  initializer_list<slang::ast::SymbolKind> *__range2_2;
  SymbolKind kind_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<slang::ast::SymbolKind> *__range2_1;
  SymbolKind kind;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<slang::ast::SymbolKind> *__range2;
  shared_ptr<slang::ast::NonConstantFunction> *in_stack_fffffffffffff678;
  initializer_list<slang::ast::SymbolKind> *in_stack_fffffffffffff680;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_fffffffffffff690;
  anon_class_1_0_00000001 *in_stack_fffffffffffff6a0;
  Builtins *in_stack_fffffffffffff6a8;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_fffffffffffff6b0;
  KnownSystemName *in_stack_fffffffffffff6b8;
  VoidType *in_stack_fffffffffffff6c0;
  KnownSystemName *in_stack_fffffffffffff6c8;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffff6f8;
  shared_ptr<slang::ast::SystemSubroutine> *method;
  undefined8 in_stack_fffffffffffff700;
  SymbolKind SVar1;
  Builtins *in_stack_fffffffffffff708;
  Builtins *this_01;
  shared_ptr<slang::ast::SystemSubroutine> local_688 [4];
  undefined1 local_645;
  undefined4 local_644;
  bool local_640 [35];
  undefined1 local_61d;
  undefined4 local_61c;
  undefined1 local_5f5;
  undefined4 local_5f4;
  undefined1 local_5cd;
  undefined4 local_5cc;
  undefined4 local_5a4;
  undefined4 local_57c;
  shared_ptr<slang::ast::SystemSubroutine> local_568;
  undefined4 local_554;
  undefined1 local_550 [16];
  undefined1 local_540 [436];
  SymbolKind local_38c [3];
  SymbolKind *local_380;
  char *local_378;
  SourceLocation local_370;
  undefined4 local_364;
  SymbolKind local_33c;
  const_iterator local_338;
  const_iterator local_330;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  SourceLocation local_318;
  Scope *local_310;
  Symbol *local_308;
  undefined1 local_2dd;
  undefined4 local_2dc;
  undefined1 local_2b5;
  undefined4 local_2b4;
  undefined1 local_28d;
  undefined4 local_28c;
  undefined1 local_265;
  undefined4 local_264;
  undefined1 local_239;
  bitwidth_t local_238;
  undefined4 local_234;
  undefined1 local_209;
  undefined4 local_208;
  undefined4 local_204;
  undefined1 local_1d9;
  Kind local_1d8;
  undefined4 local_1d4;
  undefined1 local_1a9;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined1 local_179;
  SymbolKind local_178;
  undefined4 local_174;
  undefined1 local_149;
  SymbolIndex local_148;
  undefined4 local_144;
  undefined4 local_11c;
  undefined4 local_f4;
  undefined4 local_cc;
  undefined4 local_a4;
  undefined4 local_6c;
  SyntaxKind local_44;
  SyntaxNode *local_40;
  SyntaxNode *local_38;
  SymbolKind local_30 [4];
  initializer_list<slang::ast::SymbolKind> local_20;
  initializer_list<slang::ast::SymbolKind> *local_10;
  
  local_30[0] = FixedSizeUnpackedArrayType;
  local_30[1] = 0xe;
  local_30[2] = 0x10;
  local_30[3] = 0x11;
  local_20._M_array = local_30;
  local_20._M_len = 4;
  local_10 = &local_20;
  local_38 = (SyntaxNode *)std::initializer_list<slang::ast::SymbolKind>::begin(local_10);
  local_40 = (SyntaxNode *)
             std::initializer_list<slang::ast::SymbolKind>::end(in_stack_fffffffffffff680);
  for (; local_38 != local_40; local_38 = (SyntaxNode *)&local_38->field_0x4) {
    local_44 = local_38->kind;
    local_6c = 0xee;
    std::
    make_shared<slang::ast::builtins::ArrayReductionMethod,slang::parsing::KnownSystemName,slang::ast::builtins::Builtins::registerArrayMethods()::__0>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayReductionMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71d7be);
    std::shared_ptr<slang::ast::builtins::ArrayReductionMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)0x71d7cb);
    local_a4 = 0xef;
    std::
    make_shared<slang::ast::builtins::ArrayReductionMethod,slang::parsing::KnownSystemName,slang::ast::builtins::Builtins::registerArrayMethods()::__1>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayReductionMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71d851);
    std::shared_ptr<slang::ast::builtins::ArrayReductionMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)0x71d85e);
    local_cc = 0xf0;
    std::
    make_shared<slang::ast::builtins::ArrayReductionMethod,slang::parsing::KnownSystemName,slang::ast::builtins::Builtins::registerArrayMethods()::__2>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayReductionMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71d8e4);
    std::shared_ptr<slang::ast::builtins::ArrayReductionMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)0x71d8f1);
    local_f4 = 0xf1;
    std::
    make_shared<slang::ast::builtins::ArrayReductionMethod,slang::parsing::KnownSystemName,slang::ast::builtins::Builtins::registerArrayMethods()::__3>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayReductionMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71d977);
    std::shared_ptr<slang::ast::builtins::ArrayReductionMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)0x71d984);
    local_11c = 0xf2;
    std::
    make_shared<slang::ast::builtins::ArrayReductionMethod,slang::parsing::KnownSystemName,slang::ast::builtins::Builtins::registerArrayMethods()::__4>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayReductionMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71da0a);
    std::shared_ptr<slang::ast::builtins::ArrayReductionMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayReductionMethod> *)0x71da17);
    local_144 = 0xf3;
    local_148 = 0;
    local_149 = 0;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (in_stack_fffffffffffff6b8,(Mode *)in_stack_fffffffffffff6b0,
               (bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayLocatorMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71dab8);
    std::shared_ptr<slang::ast::builtins::ArrayLocatorMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)0x71dac5);
    local_174 = 0xf4;
    local_178 = Unknown;
    local_179 = 1;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (in_stack_fffffffffffff6b8,(Mode *)in_stack_fffffffffffff6b0,
               (bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayLocatorMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71db66);
    std::shared_ptr<slang::ast::builtins::ArrayLocatorMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)0x71db73);
    local_1a4 = 0xf5;
    local_1a8 = 1;
    local_1a9 = 0;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (in_stack_fffffffffffff6b8,(Mode *)in_stack_fffffffffffff6b0,
               (bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayLocatorMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71dc14);
    std::shared_ptr<slang::ast::builtins::ArrayLocatorMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)0x71dc21);
    local_1d4 = 0xf6;
    local_1d8 = Int;
    local_1d9 = 1;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (in_stack_fffffffffffff6b8,(Mode *)in_stack_fffffffffffff6b0,
               (bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayLocatorMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71dcc2);
    std::shared_ptr<slang::ast::builtins::ArrayLocatorMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)0x71dccf);
    local_204 = 0xf7;
    local_208 = 2;
    local_209 = 0;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (in_stack_fffffffffffff6b8,(Mode *)in_stack_fffffffffffff6b0,
               (bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayLocatorMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71dd70);
    std::shared_ptr<slang::ast::builtins::ArrayLocatorMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)0x71dd7d);
    local_234._0_1_ = true;
    local_234._1_1_ = false;
    local_234._2_2_ = 0;
    local_238 = 2;
    local_239 = 1;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (in_stack_fffffffffffff6b8,(Mode *)in_stack_fffffffffffff6b0,
               (bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayLocatorMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71de1e);
    std::shared_ptr<slang::ast::builtins::ArrayLocatorMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayLocatorMethod> *)0x71de2b);
    local_264 = 0xf9;
    local_265 = 1;
    std::make_shared<slang::ast::builtins::ArrayMinMaxMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayMinMaxMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayMinMaxMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71deb9);
    std::shared_ptr<slang::ast::builtins::ArrayMinMaxMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayMinMaxMethod> *)0x71dec6);
    local_28c._0_1_ = true;
    local_28c._1_1_ = false;
    local_28c._2_2_ = 0;
    local_28d = 0;
    std::make_shared<slang::ast::builtins::ArrayMinMaxMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayMinMaxMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayMinMaxMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71df54);
    std::shared_ptr<slang::ast::builtins::ArrayMinMaxMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayMinMaxMethod> *)0x71df61);
    local_2b4 = 0xfb;
    local_2b5 = 0;
    std::make_shared<slang::ast::builtins::ArrayUniqueMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayUniqueMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayUniqueMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71dfef);
    std::shared_ptr<slang::ast::builtins::ArrayUniqueMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayUniqueMethod> *)0x71dffc);
    local_2dc = 0xfc;
    local_2dd = 1;
    std::make_shared<slang::ast::builtins::ArrayUniqueMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayUniqueMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayUniqueMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e08a);
    std::shared_ptr<slang::ast::builtins::ArrayUniqueMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayUniqueMethod> *)0x71e097);
    std::make_shared<slang::ast::builtins::ArrayMapMethod>();
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayMapMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayMapMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e102);
    std::shared_ptr<slang::ast::builtins::ArrayMapMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayMapMethod> *)0x71e10f);
  }
  local_324 = 0xe;
  local_320 = 0x10;
  local_31c = 0x11;
  local_318 = (SourceLocation)&local_324;
  local_310 = (Scope *)0x3;
  local_308 = (Symbol *)&local_318;
  local_330 = std::initializer_list<slang::ast::SymbolKind>::begin
                        ((initializer_list<slang::ast::SymbolKind> *)local_308);
  local_338 = std::initializer_list<slang::ast::SymbolKind>::end(in_stack_fffffffffffff680);
  for (; local_330 != local_338; local_330 = local_330 + 1) {
    local_33c = *local_330;
    local_364 = 0xed;
    std::
    make_shared<slang::ast::builtins::ArraySizeMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
              (in_stack_fffffffffffff6a8,(KnownSystemName *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArraySizeMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArraySizeMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e57c);
    std::shared_ptr<slang::ast::builtins::ArraySizeMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArraySizeMethod> *)0x71e589);
  }
  local_38c[0] = FixedSizeUnpackedArrayType;
  local_38c[1] = DynamicArrayType;
  local_38c[2] = 0x11;
  local_380 = local_38c;
  local_378 = (char *)0x3;
  local_370 = (SourceLocation)&local_380;
  local_540._424_8_ =
       std::initializer_list<slang::ast::SymbolKind>::begin
                 ((initializer_list<slang::ast::SymbolKind> *)local_370);
  local_540._416_8_ = std::initializer_list<slang::ast::SymbolKind>::end(in_stack_fffffffffffff680);
  for (; SVar1 = (SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20),
      local_540._424_8_ != local_540._416_8_;
      local_540._424_8_ = &((Symbol *)local_540._424_8_)->field_0x4) {
    local_540._412_4_ = ((Symbol *)local_540._424_8_)->kind;
    local_540._372_4_ = 0xfd;
    local_540[0x173] = 0;
    std::make_shared<slang::ast::builtins::ArraySortMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArraySortMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArraySortMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e701);
    std::shared_ptr<slang::ast::builtins::ArraySortMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArraySortMethod> *)0x71e70e);
    local_540._332_4_ = 0xfe;
    local_540[0x14b] = 1;
    std::make_shared<slang::ast::builtins::ArraySortMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArraySortMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArraySortMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e79c);
    std::shared_ptr<slang::ast::builtins::ArraySortMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArraySortMethod> *)0x71e7a9);
    std::make_shared<slang::ast::builtins::ArrayReverseMethod>();
    std::shared_ptr<slang::ast::SystemSubroutine>::
    shared_ptr<slang::ast::builtins::ArrayReverseMethod,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               (shared_ptr<slang::ast::builtins::ArrayReverseMethod> *)in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e814);
    std::shared_ptr<slang::ast::builtins::ArrayReverseMethod>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::ArrayReverseMethod> *)0x71e821);
    local_540._260_4_ = 0xff;
    local_540._256_4_ = Bit;
    local_540._232_8_ = (SyntaxNode *)0x0;
    local_540._240_8_ = (Type *)0x0;
    local_540._248_4_ = 0;
    local_540[0xfc] = false;
    local_540[0xfd] = false;
    local_540._254_2_ = 0;
    std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
              ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
               0x71e887);
    local_540[0xe7] = 1;
    std::
    make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
              (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,(int *)in_stack_fffffffffffff6b8,
               in_stack_fffffffffffff6b0,(bool *)in_stack_fffffffffffff6a8);
    std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::NonConstantFunction,void>
              ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
               in_stack_fffffffffffff678);
    addSystemMethod(in_stack_fffffffffffff708,(SymbolKind)((ulong)in_stack_fffffffffffff700 >> 0x20)
                    ,in_stack_fffffffffffff6f8);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x71e90e);
    std::shared_ptr<slang::ast::NonConstantFunction>::~shared_ptr
              ((shared_ptr<slang::ast::NonConstantFunction> *)0x71e91b);
    std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
              (in_stack_fffffffffffff690);
  }
  local_540._188_4_ = 0x100;
  std::
  make_shared<slang::ast::builtins::ArraySizeMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffff6a8,(KnownSystemName *)in_stack_fffffffffffff6a0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ArraySizeMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::ArraySizeMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(in_stack_fffffffffffff708,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71eaa6);
  std::shared_ptr<slang::ast::builtins::ArraySizeMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ArraySizeMethod> *)0x71eab3);
  std::make_shared<slang::ast::builtins::DynArrayDeleteMethod,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffff6a8);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DynArrayDeleteMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::DynArrayDeleteMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(in_stack_fffffffffffff708,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71eb16);
  std::shared_ptr<slang::ast::builtins::DynArrayDeleteMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DynArrayDeleteMethod> *)0x71eb23);
  std::make_shared<slang::ast::builtins::AssocArrayDeleteMethod>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssocArrayDeleteMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::AssocArrayDeleteMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(in_stack_fffffffffffff708,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71eb7e);
  std::shared_ptr<slang::ast::builtins::AssocArrayDeleteMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssocArrayDeleteMethod> *)0x71eb8b);
  std::make_shared<slang::ast::builtins::QueueDeleteMethod>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::QueueDeleteMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::QueueDeleteMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(in_stack_fffffffffffff708,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71ebe6);
  std::shared_ptr<slang::ast::builtins::QueueDeleteMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::QueueDeleteMethod> *)0x71ebf3);
  std::make_shared<slang::ast::builtins::AssocArrayExistsMethod>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssocArrayExistsMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::AssocArrayExistsMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(in_stack_fffffffffffff708,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71ec4e);
  std::shared_ptr<slang::ast::builtins::AssocArrayExistsMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssocArrayExistsMethod> *)0x71ec5b);
  local_540._20_4_ = 0x101;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff6a8);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)
             in_stack_fffffffffffff678);
  addSystemMethod(in_stack_fffffffffffff708,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71ecc9);
  std::shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)0x71ecd6);
  local_554 = 0x102;
  SVar1 = (SymbolKind)((ulong)local_550 >> 0x20);
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff6a8);
  this_01 = (Builtins *)local_540;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)
             in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,in_stack_fffffffffffff6f8);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71ed44);
  std::shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)0x71ed51);
  local_57c = 0x103;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff6a8);
  method = &local_568;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)
             in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71edb9);
  std::shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)0x71edc6);
  local_5a4 = 0x104;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_fffffffffffff6a8);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)
             in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71ee28);
  std::shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssocArrayTraversalMethod> *)0x71ee35);
  local_5cc = 0x105;
  local_5cd = 1;
  std::make_shared<slang::ast::builtins::QueuePopMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::QueuePopMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::QueuePopMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71eea7);
  std::shared_ptr<slang::ast::builtins::QueuePopMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::QueuePopMethod> *)0x71eeb4);
  local_5f4 = 0x106;
  local_5f5 = 0;
  std::make_shared<slang::ast::builtins::QueuePopMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::QueuePopMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::QueuePopMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71ef26);
  std::shared_ptr<slang::ast::builtins::QueuePopMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::QueuePopMethod> *)0x71ef33);
  local_61c = 0x107;
  local_61d = 1;
  std::make_shared<slang::ast::builtins::QueuePushMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff6a8,(bool *)in_stack_fffffffffffff6a0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::QueuePushMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::QueuePushMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71efa5);
  std::shared_ptr<slang::ast::builtins::QueuePushMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::QueuePushMethod> *)0x71efb2);
  local_644 = 0x108;
  local_645 = 0;
  std::make_shared<slang::ast::builtins::QueuePushMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffff6a8,local_640);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::QueuePushMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::QueuePushMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71f024);
  std::shared_ptr<slang::ast::builtins::QueuePushMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::QueuePushMethod> *)0x71f031);
  std::make_shared<slang::ast::builtins::QueueInsertMethod>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::QueueInsertMethod,void>
            ((shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffff680,
             (shared_ptr<slang::ast::builtins::QueueInsertMethod> *)in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71f080);
  std::shared_ptr<slang::ast::builtins::QueueInsertMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::QueueInsertMethod> *)0x71f08d);
  this_00 = local_688;
  std::make_shared<slang::ast::builtins::IteratorIndexMethod>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::IteratorIndexMethod,void>
            (this_00,(shared_ptr<slang::ast::builtins::IteratorIndexMethod> *)
                     in_stack_fffffffffffff678);
  addSystemMethod(this_01,SVar1,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x71f0dc);
  std::shared_ptr<slang::ast::builtins::IteratorIndexMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::IteratorIndexMethod> *)0x71f0e9);
  return;
}

Assistant:

void Builtins::registerArrayMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_shared<name##Method>(__VA_ARGS__))

    for (auto kind : {SymbolKind::FixedSizeUnpackedArrayType, SymbolKind::DynamicArrayType,
                      SymbolKind::AssociativeArrayType, SymbolKind::QueueType}) {
        REGISTER(kind, ArrayReduction, KnownSystemName::Or, [](auto& l, auto& r) { l |= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::And, [](auto& l, auto& r) { l &= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::XOr, [](auto& l, auto& r) { l ^= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::Sum, [](auto& l, auto& r) { l += r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::Product, [](auto& l, auto& r) { l *= r; });

        REGISTER(kind, ArrayLocator, KnownSystemName::Find, ArrayLocatorMethod::All, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindIndex, ArrayLocatorMethod::All, true);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindFirst, ArrayLocatorMethod::First, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindFirstIndex, ArrayLocatorMethod::First,
                 true);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindLast, ArrayLocatorMethod::Last, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindLastIndex, ArrayLocatorMethod::Last,
                 true);

        REGISTER(kind, ArrayMinMax, KnownSystemName::Min, true);
        REGISTER(kind, ArrayMinMax, KnownSystemName::Max, false);

        REGISTER(kind, ArrayUnique, KnownSystemName::Unique, false);
        REGISTER(kind, ArrayUnique, KnownSystemName::UniqueIndex, true);

        REGISTER(kind, ArrayMap, );
    }

    for (auto kind :
         {SymbolKind::DynamicArrayType, SymbolKind::AssociativeArrayType, SymbolKind::QueueType}) {
        REGISTER(kind, ArraySize, *this, KnownSystemName::ArraySize);
    }

    for (auto kind : {SymbolKind::FixedSizeUnpackedArrayType, SymbolKind::DynamicArrayType,
                      SymbolKind::QueueType}) {
        REGISTER(kind, ArraySort, KnownSystemName::Sort, false);
        REGISTER(kind, ArraySort, KnownSystemName::Rsort, true);
        REGISTER(kind, ArrayReverse, );

        addSystemMethod(kind,
                        std::make_shared<NonConstantFunction>(KnownSystemName::Shuffle, voidType, 0,
                                                              std::vector<const Type*>{}, true));
    }

    // Associative arrays also alias "size" to "num" for some reason.
    REGISTER(SymbolKind::AssociativeArrayType, ArraySize, *this, KnownSystemName::Num);

    // "delete" methods
    REGISTER(SymbolKind::DynamicArrayType, DynArrayDelete, *this);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayDelete, );
    REGISTER(SymbolKind::QueueType, QueueDelete, );

    // Associative array methods.
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayExists, );
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::First);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Last);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Next);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Prev);

    // Queue methods
    REGISTER(SymbolKind::QueueType, QueuePop, KnownSystemName::PopFront, true);
    REGISTER(SymbolKind::QueueType, QueuePop, KnownSystemName::PopBack, false);
    REGISTER(SymbolKind::QueueType, QueuePush, KnownSystemName::PushFront, true);
    REGISTER(SymbolKind::QueueType, QueuePush, KnownSystemName::PushBack, false);
    REGISTER(SymbolKind::QueueType, QueueInsert, );

    // Iterator methods
    REGISTER(SymbolKind::Iterator, IteratorIndex, );
}